

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  ImU32 IVar1;
  char *pcVar2;
  size_t data_size;
  ImGuiWindowSettings *this;
  ImGuiWindowSettings *this_00;
  char *in_RDI;
  ImGuiWindowSettings *settings;
  size_t chunk_size;
  size_t name_len;
  char *p;
  ImGuiContext *g;
  size_t in_stack_ffffffffffffffb8;
  ImChunkStream<ImGuiWindowSettings> *in_stack_ffffffffffffffc0;
  char *local_8;
  
  pcVar2 = strstr(in_RDI,"###");
  local_8 = in_RDI;
  if (pcVar2 != (char *)0x0) {
    local_8 = pcVar2;
  }
  data_size = strlen(local_8);
  this = ImChunkStream<ImGuiWindowSettings>::alloc_chunk
                   (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = (ImGuiWindowSettings *)operator_new(0x10);
  ImGuiWindowSettings::ImGuiWindowSettings(this_00);
  IVar1 = ImHashStr(local_8,data_size,0);
  this->ID = IVar1;
  pcVar2 = ImGuiWindowSettings::GetName(this);
  memcpy(pcVar2,local_8,data_size + 1);
  return this;
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;

#if !IMGUI_DEBUG_INI_SETTINGS
    // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
    // Preserve the full string when IMGUI_DEBUG_INI_SETTINGS is set to make .ini inspection easier.
    if (const char* p = strstr(name, "###"))
        name = p;
#endif
    const size_t name_len = strlen(name);

    // Allocate chunk
    const size_t chunk_size = sizeof(ImGuiWindowSettings) + name_len + 1;
    ImGuiWindowSettings* settings = g.SettingsWindows.alloc_chunk(chunk_size);
    IM_PLACEMENT_NEW(settings) ImGuiWindowSettings();
    settings->ID = ImHashStr(name, name_len);
    memcpy(settings->GetName(), name, name_len + 1);   // Store with zero terminator

    return settings;
}